

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_unittest.cc
# Opt level: O0

void __thiscall bssl::der::test::InputTest_ConstExpr_Test::TestBody(InputTest_ConstExpr_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80 [3];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  Input runtime_input;
  Input ptr_len_input;
  Input const_array_input;
  Input default_input;
  InputTest_ConstExpr_Test *this_local;
  
  runtime_input.data_.size_ = (size_t)&kInput;
  Input::Input((Input *)&gtest_ar.message_,"tealN4bssl3der4test21InputTest_Equals_TestE",2);
  testing::internal::EqHelper::Compare<bssl::der::Input,_bssl::der::Input,_nullptr>
            ((EqHelper *)local_68,"runtime_input","ptr_len_input",(Input *)&gtest_ar.message_,
             (Input *)&runtime_input.data_.size_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/input_unittest.cc"
               ,0x52,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(InputTest, ConstExpr) {
  constexpr Input default_input;
  static_assert(default_input.size() == 0);
  static_assert(default_input.data() == nullptr);

  constexpr Input const_array_input(kInput);
  static_assert(const_array_input.size() == 4);
  static_assert(const_array_input.data() == kInput);
  static_assert(default_input < const_array_input);

  constexpr Input ptr_len_input(kInput, 2);
  static_assert(ptr_len_input.size() == 2);
  static_assert(ptr_len_input.data() == kInput);
  static_assert(ptr_len_input < const_array_input);

  Input runtime_input(kInput2, 2);
  EXPECT_EQ(runtime_input, ptr_len_input);
}